

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Pooling_x86_avx::forward(Pooling_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 (*pauVar25) [32];
  float *pfVar26;
  undefined1 (*pauVar27) [16];
  int iVar28;
  Mat *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_size;
  int stride;
  __m128 _avg_5;
  __m128 _val_9;
  int k_3;
  __m128 _sum_5;
  float *sptr_3;
  int j_7;
  int i_11;
  __m128 _inv_maxk_1;
  float *outptr_9;
  Mat m_5;
  int q_9;
  __m128 _avg_4;
  __m128 _inv_area_1;
  __m128 _val_8;
  int sx_1;
  int kj_1;
  int sy_1;
  int ki_1;
  int area_1;
  __m128 _sum_4;
  int sx0_1;
  int j_6;
  int sy0_1;
  int i_10;
  float *outptr_8;
  Mat m_4;
  int q_8;
  int htailpad_1;
  int wtailpad_1;
  __m128 _val_7;
  int k_2;
  __m128 _max_3;
  float *sptr_2;
  int j_5;
  int i_9;
  float *outptr_7;
  Mat m_3;
  int q_7;
  int j_4;
  int i_8;
  int gap_1;
  int p2_1;
  int p1_1;
  int *space_ofs_1;
  vector<int,_std::allocator<int>_> _space_ofs_1;
  int maxk_1;
  int outh_2;
  int outw_2;
  Mat bottom_blob_bordered_2;
  float *outptr_6;
  __m128 _avg_3;
  __m128 _inv_size_1;
  __m128 _val_6;
  int i_7;
  __m128 _sum_3;
  float *ptr_3;
  int q_6;
  float *outptr_5;
  __m128 _val_5;
  int i_6;
  __m128 _max_2;
  float *ptr_2;
  int q_5;
  int size_1;
  __m256 _avg_2;
  __m256 _val_4;
  int k_1;
  __m256 _sum_2;
  float *sptr_1;
  int j_3;
  int i_5;
  __m256 _inv_maxk;
  float *outptr_4;
  Mat m_2;
  int q_4;
  __m256 _avg_1;
  __m256 _inv_area;
  __m256 _val_3;
  int sx;
  int kj;
  int sy;
  int ki;
  int area;
  __m256 _sum_1;
  int sx0;
  int j_2;
  int sy0;
  int i_4;
  float *outptr_3;
  Mat m_1;
  int q_3;
  int htailpad;
  int wtailpad;
  __m256 _val_2;
  int k;
  __m256 _max_1;
  float *sptr;
  int j_1;
  int i_3;
  float *outptr_2;
  Mat m;
  int q_2;
  int j;
  int i_2;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh_1;
  int outw_1;
  Mat bottom_blob_bordered_1;
  float *outptr_1;
  __m256 _avg;
  __m256 _inv_size;
  __m256 _val_1;
  int i_1;
  __m256 _sum;
  float *ptr_1;
  int q_1;
  float *outptr;
  __m256 _val;
  int i;
  __m256 _max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int elempack;
  undefined4 in_stack_ffffffffffffe828;
  int in_stack_ffffffffffffe82c;
  undefined4 in_stack_ffffffffffffe830;
  undefined2 in_stack_ffffffffffffe834;
  undefined1 in_stack_ffffffffffffe836;
  undefined1 in_stack_ffffffffffffe837;
  allocator_type *in_stack_ffffffffffffe838;
  Mat *pMVar35;
  int in_stack_ffffffffffffe840;
  int in_stack_ffffffffffffe844;
  undefined4 in_stack_ffffffffffffe848;
  float in_stack_ffffffffffffe84c;
  float in_stack_ffffffffffffe850;
  float in_stack_ffffffffffffe854;
  undefined4 in_stack_ffffffffffffe858;
  undefined4 in_stack_ffffffffffffe85c;
  Option *local_16e0;
  Mat *in_stack_ffffffffffffe930;
  Mat *in_stack_ffffffffffffe938;
  undefined6 in_stack_ffffffffffffe970;
  Mat *in_stack_ffffffffffffe980;
  Option *in_stack_ffffffffffffe990;
  Mat *in_stack_ffffffffffffe998;
  undefined4 in_stack_ffffffffffffe9a0;
  undefined4 in_stack_ffffffffffffe9a4;
  undefined4 in_stack_ffffffffffffe9a8;
  undefined4 in_stack_ffffffffffffe9ac;
  Option *in_stack_ffffffffffffea00;
  Mat *in_stack_ffffffffffffea08;
  Mat *in_stack_ffffffffffffea10;
  Option *in_stack_ffffffffffffeaf0;
  Mat *in_stack_ffffffffffffeaf8;
  undefined4 in_stack_ffffffffffffeb00;
  undefined4 in_stack_ffffffffffffeb04;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  Mat local_1390;
  int local_1348;
  int local_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  int local_1314;
  undefined8 local_1310;
  undefined8 uStack_1308;
  float *local_1300;
  int local_12f8;
  int local_12f4;
  undefined1 local_12f0 [16];
  Mat local_12e0;
  float *local_1298;
  Mat local_1290;
  int local_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  int local_1204;
  int local_1200;
  int local_11fc;
  int local_11f8;
  int local_11f4;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  int local_11d8;
  int local_11d4;
  int local_11d0;
  int local_11cc;
  Option *in_stack_ffffffffffffee48;
  Mat *in_stack_ffffffffffffee50;
  Mat *in_stack_ffffffffffffee58;
  Pooling *in_stack_ffffffffffffee60;
  float *local_1180;
  Mat local_1178;
  int local_112c;
  int local_1128;
  int local_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  int local_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  float *local_10e8;
  int local_10e0;
  int local_10dc;
  Mat local_10d8;
  float *local_1090;
  Mat local_1088;
  int local_1040;
  int local_103c;
  int local_1038;
  int local_1034;
  int local_1030;
  int local_102c;
  reference local_1028;
  vector<int,_std::allocator<int>_> local_1018;
  int local_ffc;
  int local_ff8;
  int local_ff4;
  Mat local_ff0;
  float *local_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  int local_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  Mat local_f50;
  float *local_f08;
  int local_efc;
  float *local_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  int local_ed4;
  undefined1 local_ed0 [16];
  Option *in_stack_fffffffffffff148;
  Mat *in_stack_fffffffffffff150;
  Mat *in_stack_fffffffffffff158;
  undefined1 (*local_e70) [16];
  int local_e68;
  int local_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  int local_dc8;
  int local_dc4;
  Mat local_da0;
  float *local_d58;
  Mat local_d50;
  int local_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  int local_c94;
  int local_c90;
  int local_c8c;
  int local_c88;
  int local_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  int local_c58;
  int local_c54;
  int local_c50;
  int local_c4c;
  Mat local_c48;
  float *local_c00;
  Mat local_bf8;
  int local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  int local_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float *local_b28;
  int local_b20;
  int local_b1c;
  Mat local_b18;
  float *local_ad0;
  Mat local_ac8;
  int local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  int local_a70;
  int local_a6c;
  reference local_a68;
  vector<int,_std::allocator<int>_> local_a58;
  int local_a40;
  int local_a3c;
  int local_a38;
  undefined4 local_a34;
  Mat local_a30;
  float *local_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  int local_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  Mat local_940;
  float *local_8f8;
  int local_8ec;
  float *local_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  int local_8a4;
  undefined1 local_8a0 [32];
  Mat local_870;
  undefined1 (*local_828) [32];
  int local_820;
  int local_81c;
  undefined8 local_818;
  int local_810;
  int local_80c;
  int local_808;
  int local_804;
  Mat *local_7f8;
  long local_7f0;
  int local_7dc;
  float *local_7d8;
  float *local_7d0;
  undefined1 (*local_7c8) [32];
  float *local_7c0;
  float *local_7b8;
  undefined1 (*local_7b0) [32];
  undefined1 (*local_7a8) [32];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float *local_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 (*local_668) [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float *local_600;
  undefined4 local_5f8;
  float local_5f4;
  float local_5f0;
  undefined4 local_5ec;
  float local_5e8;
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float *local_458;
  float *local_450;
  undefined1 (*local_448) [16];
  float *local_440;
  float *local_438;
  undefined1 (*local_430) [16];
  undefined1 (*local_428) [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 (*local_3c8) [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 (*local_3a8) [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 (*local_388) [16];
  undefined8 local_380;
  undefined8 uStack_378;
  float *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float *local_348;
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  undefined4 local_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float local_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float local_2e4;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 local_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float local_2a4;
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 local_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_250 [8];
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [8];
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined1 local_180 [32];
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_100 [32];
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
    local_804 = *(int *)(in_RSI + 0x18);
    local_808 = *(int *)(in_RSI + 0x2c);
    local_80c = *(int *)(in_RSI + 0x30);
    local_810 = *(int *)(in_RSI + 0x38);
    local_818 = *(undefined8 *)(in_RSI + 0x10);
    local_7f8 = in_RDX;
    local_7f0 = in_RSI;
    if (local_804 == 8) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) == 0) {
        ncnn::Mat::Mat(&local_a30);
        Pooling::make_padding
                  ((Pooling *)CONCAT44(in_stack_ffffffffffffe9ac,in_stack_ffffffffffffe9a8),
                   (Mat *)CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                   in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
        bVar22 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                  in_stack_ffffffffffffe828));
        if (bVar22) {
          local_7dc = -100;
          local_a34 = 1;
        }
        else {
          local_808 = local_a30.w;
          local_80c = local_a30.h;
          local_a38 = (local_a30.w - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)) /
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + 1;
          local_a3c = (local_a30.h - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)) /
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) + 1;
          ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                            in_stack_ffffffffffffe844,in_stack_ffffffffffffe840,
                            (int)((ulong)in_stack_ffffffffffffe838 >> 0x20),
                            CONCAT17(in_stack_ffffffffffffe837,
                                     CONCAT16(in_stack_ffffffffffffe836,
                                              CONCAT24(in_stack_ffffffffffffe834,
                                                       in_stack_ffffffffffffe830))),
                            in_stack_ffffffffffffe82c,
                            (Allocator *)
                            CONCAT44(in_stack_ffffffffffffe85c,in_stack_ffffffffffffe858));
          bVar22 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                    in_stack_ffffffffffffe828));
          if (bVar22) {
            local_7dc = -100;
            local_a34 = 1;
          }
          else {
            local_a40 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            std::allocator<int>::allocator((allocator<int> *)0x4c6682);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                       CONCAT44(in_stack_ffffffffffffe844,in_stack_ffffffffffffe840),
                       in_stack_ffffffffffffe838);
            std::allocator<int>::~allocator((allocator<int> *)0x4c66ae);
            local_a68 = std::vector<int,_std::allocator<int>_>::operator[](&local_a58,0);
            local_a6c = 0;
            local_a70 = 0;
            local_a74 = local_808 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            for (local_a78 = 0;
                local_a78 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                local_a78 = local_a78 + 1) {
              for (local_a7c = 0;
                  local_a7c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_a7c = local_a7c + 1) {
                local_a68[local_a6c] = local_a70;
                local_a6c = local_a6c + 1;
                local_a70 = local_a70 + 1;
              }
              local_a70 = local_a74 + local_a70;
            }
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
              if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 2) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 2)) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 2)) &&
                 (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2)) {
                pooling2x2s2_max_pack8_avx
                          (in_stack_ffffffffffffea10,in_stack_ffffffffffffea08,
                           in_stack_ffffffffffffea00);
              }
              else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 2 &&
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2)))) {
                pooling3x3s2_max_pack8_avx
                          (in_stack_fffffffffffff158,in_stack_fffffffffffff150,
                           in_stack_fffffffffffff148);
              }
              else {
                for (local_a80 = 0; local_a80 < local_810; local_a80 = local_a80 + 1) {
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  pfVar26 = ncnn::Mat::operator_cast_to_float_(&local_b18);
                  ncnn::Mat::~Mat((Mat *)0x4c69f6);
                  local_ad0 = pfVar26;
                  for (local_b1c = 0; local_b1c < local_a3c; local_b1c = local_b1c + 1) {
                    for (local_b20 = 0; local_b20 < local_a38; local_b20 = local_b20 + 1) {
                      local_b28 = ncnn::Mat::row(&local_ac8,
                                                 local_b1c *
                                                 *(int *)((long)in_RDI +
                                                         *(long *)(*in_RDI + -0x18) + 0xe0));
                      local_b28 = local_b28 +
                                  local_b20 *
                                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 8;
                      local_b60 = *(undefined8 *)local_b28;
                      uStack_b58 = *(undefined8 *)(local_b28 + 2);
                      uStack_b50 = *(undefined8 *)(local_b28 + 4);
                      uStack_b48 = *(undefined8 *)(local_b28 + 6);
                      for (local_b64 = 0; local_b64 < local_a40; local_b64 = local_b64 + 1) {
                        local_7c8 = (undefined1 (*) [32])(local_b28 + (local_a68[local_b64] << 3));
                        local_ba0 = *(undefined8 *)*local_7c8;
                        uStack_b98 = *(undefined8 *)(*local_7c8 + 8);
                        uStack_b90 = *(undefined8 *)(*local_7c8 + 0x10);
                        uStack_b88 = *(undefined8 *)(*local_7c8 + 0x18);
                        local_780 = local_b60;
                        uStack_778 = uStack_b58;
                        uStack_770 = uStack_b50;
                        uStack_768 = uStack_b48;
                        auVar18._8_8_ = uStack_b58;
                        auVar18._0_8_ = local_b60;
                        auVar18._16_8_ = uStack_b50;
                        auVar18._24_8_ = uStack_b48;
                        auVar29 = vmaxps_avx(auVar18,*local_7c8);
                        local_1460 = auVar29._0_8_;
                        uStack_1458 = auVar29._8_8_;
                        uStack_1450 = auVar29._16_8_;
                        uStack_1448 = auVar29._24_8_;
                        local_b60 = local_1460;
                        uStack_b58 = uStack_1458;
                        uStack_b50 = uStack_1450;
                        uStack_b48 = uStack_1448;
                        local_7a0 = local_ba0;
                        uStack_798 = uStack_b98;
                        uStack_790 = uStack_b90;
                        uStack_788 = uStack_b88;
                      }
                      local_668 = (undefined1 (*) [32])(local_ad0 + (local_b20 << 3));
                      local_6a0 = local_b60;
                      uStack_698 = uStack_b58;
                      uStack_690 = uStack_b50;
                      uStack_688 = uStack_b48;
                      auVar19._8_8_ = uStack_b58;
                      auVar19._0_8_ = local_b60;
                      auVar19._16_8_ = uStack_b50;
                      auVar19._24_8_ = uStack_b48;
                      *local_668 = auVar19;
                      local_7c0 = local_b28;
                    }
                    local_ad0 = local_ad0 + (local_a38 << 3);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c6cbd);
                }
              }
            }
            else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) {
                local_ba4 = 0;
                local_ba8 = 0;
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 0) {
                  local_ba4 = ((local_a30.w - *(int *)(local_7f0 + 0x2c)) -
                              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4)) -
                              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8);
                  local_ba8 = ((local_a30.h - *(int *)(local_7f0 + 0x30)) -
                              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec)) -
                              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
                }
                for (local_bac = 0; local_bac < local_810; local_bac = local_bac + 1) {
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  pfVar26 = ncnn::Mat::operator_cast_to_float_(&local_c48);
                  ncnn::Mat::~Mat((Mat *)0x4c6e44);
                  local_c00 = pfVar26;
                  for (local_c4c = 0; local_c4c < local_a3c; local_c4c = local_c4c + 1) {
                    local_c50 = local_c4c *
                                *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
                    for (local_c54 = 0; local_c54 < local_a38; local_c54 = local_c54 + 1) {
                      local_c58 = local_c54 *
                                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
                      local_5ec = 0;
                      local_104 = 0;
                      local_108 = 0;
                      local_10c = 0;
                      local_110 = 0;
                      local_114 = 0;
                      local_118 = 0;
                      local_11c = 0;
                      local_120 = 0;
                      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
                      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
                      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
                      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
                      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
                      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
                      auVar31._16_16_ = auVar1;
                      auVar31._0_16_ = auVar2;
                      local_140._0_8_ = auVar2._0_8_;
                      local_140._8_8_ = auVar2._8_8_;
                      local_140._16_8_ = auVar1._0_8_;
                      local_140._24_8_ = auVar1._8_8_;
                      local_c80 = local_140._0_8_;
                      uStack_c78 = local_140._8_8_;
                      uStack_c70 = local_140._16_8_;
                      uStack_c68 = local_140._24_8_;
                      local_c84 = 0;
                      local_140 = auVar31;
                      for (local_c88 = 0;
                          local_c88 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                          local_c88 = local_c88 + 1) {
                        local_c8c = local_c50 + local_c88;
                        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) <= local_c8c)
                        {
                          if ((local_80c -
                              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0)) -
                              local_ba8 <= local_c8c) break;
                          for (local_c90 = 0;
                              local_c90 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
                              ; local_c90 = local_c90 + 1) {
                            local_c94 = local_c58 + local_c90;
                            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) <=
                                local_c94) {
                              if ((local_808 -
                                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) -
                                  local_ba4 <= local_c94) break;
                              local_7d0 = ncnn::Mat::row(&local_bf8,local_c8c);
                              local_7d0 = local_7d0 + (local_c94 << 3);
                              local_cc0 = *(undefined8 *)local_7d0;
                              uStack_cb8 = *(undefined8 *)(local_7d0 + 2);
                              uStack_cb0 = *(undefined8 *)(local_7d0 + 4);
                              uStack_ca8 = *(undefined8 *)(local_7d0 + 6);
                              auVar17._8_8_ = uStack_c78;
                              auVar17._0_8_ = local_c80;
                              auVar17._16_8_ = uStack_c70;
                              auVar17._24_8_ = uStack_c68;
                              local_580._0_4_ = (undefined4)local_c80;
                              local_580._4_4_ = (undefined4)((ulong)local_c80 >> 0x20);
                              fStack_578 = (float)uStack_c78;
                              fStack_574 = (float)((ulong)uStack_c78 >> 0x20);
                              fStack_570 = (float)uStack_c70;
                              fStack_56c = (float)((ulong)uStack_c70 >> 0x20);
                              fStack_568 = (float)uStack_c68;
                              fStack_564 = (float)((ulong)uStack_c68 >> 0x20);
                              local_5a0._0_4_ = (float)local_cc0;
                              local_5a0._4_4_ = (float)((ulong)local_cc0 >> 0x20);
                              uStack_598._0_4_ = (float)uStack_cb8;
                              uStack_598._4_4_ = (float)((ulong)uStack_cb8 >> 0x20);
                              uStack_590._0_4_ = (float)uStack_cb0;
                              uStack_590._4_4_ = (float)((ulong)uStack_cb0 >> 0x20);
                              uStack_588._0_4_ = (float)uStack_ca8;
                              uStack_588._4_4_ = (float)((ulong)uStack_ca8 >> 0x20);
                              local_c80 = CONCAT44((float)local_580._4_4_ + local_5a0._4_4_,
                                                   (float)local_580._0_4_ + (float)local_5a0);
                              uStack_c78 = CONCAT44(fStack_574 + uStack_598._4_4_,
                                                    fStack_578 + (float)uStack_598);
                              uStack_c70 = CONCAT44(fStack_56c + uStack_590._4_4_,
                                                    fStack_570 + (float)uStack_590);
                              uStack_c68 = CONCAT44(fStack_564 + uStack_588._4_4_,
                                                    fStack_568 + (float)uStack_588);
                              local_c84 = local_c84 + 1;
                              local_5a0 = local_cc0;
                              uStack_598 = uStack_cb8;
                              uStack_590 = uStack_cb0;
                              uStack_588 = uStack_ca8;
                              _local_580 = auVar17;
                            }
                          }
                        }
                      }
                      local_5f0 = 1.0 / (float)local_c84;
                      auVar1 = vinsertps_avx(ZEXT416((uint)local_5f0),ZEXT416((uint)local_5f0),0x10)
                      ;
                      auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_5f0),0x20);
                      auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_5f0),0x30);
                      auVar2 = vinsertps_avx(ZEXT416((uint)local_5f0),ZEXT416((uint)local_5f0),0x10)
                      ;
                      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_5f0),0x20);
                      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_5f0),0x30);
                      auVar32._16_16_ = auVar1;
                      auVar32._0_16_ = auVar2;
                      local_100._0_8_ = auVar2._0_8_;
                      local_100._8_8_ = auVar2._8_8_;
                      local_100._16_8_ = auVar1._0_8_;
                      local_100._24_8_ = auVar1._8_8_;
                      local_ce0 = local_100._0_8_;
                      uStack_cd8 = local_100._8_8_;
                      uStack_cd0 = local_100._16_8_;
                      uStack_cc8 = local_100._24_8_;
                      local_4c0._0_4_ = (float)local_c80;
                      local_4c0._4_4_ = (float)((ulong)local_c80 >> 0x20);
                      uStack_4b8._0_4_ = (float)uStack_c78;
                      uStack_4b8._4_4_ = (float)((ulong)uStack_c78 >> 0x20);
                      uStack_4b0._0_4_ = (float)uStack_c70;
                      uStack_4b0._4_4_ = (float)((ulong)uStack_c70 >> 0x20);
                      uStack_4a8._0_4_ = (float)uStack_c68;
                      uStack_4a8._4_4_ = (undefined4)((ulong)uStack_c68 >> 0x20);
                      local_4e0._0_4_ = auVar2._0_4_;
                      local_4e0._4_4_ = auVar2._4_4_;
                      uStack_4d8._0_4_ = auVar2._8_4_;
                      uStack_4d8._4_4_ = auVar2._12_4_;
                      uStack_4d0._0_4_ = auVar1._0_4_;
                      uStack_4d0._4_4_ = auVar1._4_4_;
                      uStack_4c8._0_4_ = auVar1._8_4_;
                      local_d00 = CONCAT44(local_4c0._4_4_ * local_4e0._4_4_,
                                           (float)local_4c0 * (float)local_4e0);
                      uStack_cf8 = CONCAT44(uStack_4b8._4_4_ * uStack_4d8._4_4_,
                                            (float)uStack_4b8 * (float)uStack_4d8);
                      uStack_cf0 = CONCAT44(uStack_4b0._4_4_ * uStack_4d0._4_4_,
                                            (float)uStack_4b0 * (float)uStack_4d0);
                      uStack_ce8 = CONCAT44(uStack_4a8._4_4_,(float)uStack_4a8 * (float)uStack_4c8);
                      local_6a8 = local_c00 + (local_c54 << 3);
                      *(undefined8 *)local_6a8 = local_d00;
                      *(undefined8 *)(local_6a8 + 2) = uStack_cf8;
                      *(undefined8 *)(local_6a8 + 4) = uStack_cf0;
                      *(undefined8 *)(local_6a8 + 6) = uStack_ce8;
                      local_6e0 = local_d00;
                      uStack_6d8 = uStack_cf8;
                      uStack_6d0 = uStack_cf0;
                      uStack_6c8 = uStack_ce8;
                      local_4e0 = local_100._0_8_;
                      uStack_4d8 = local_100._8_8_;
                      uStack_4d0 = local_100._16_8_;
                      uStack_4c8 = local_100._24_8_;
                      local_4c0 = local_c80;
                      uStack_4b8 = uStack_c78;
                      uStack_4b0 = uStack_c70;
                      uStack_4a8 = uStack_c68;
                      local_100 = auVar32;
                      local_e0 = local_5f0;
                      local_dc = local_5f0;
                      local_d8 = local_5f0;
                      local_d4 = local_5f0;
                      local_d0 = local_5f0;
                      local_cc = local_5f0;
                      local_c8 = local_5f0;
                      local_c4 = local_5f0;
                    }
                    local_c00 = local_c00 + (local_a38 << 3);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c747b);
                }
              }
              else {
                for (local_d04 = 0; local_d04 < local_810; local_d04 = local_d04 + 1) {
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  pfVar26 = ncnn::Mat::operator_cast_to_float_(&local_da0);
                  ncnn::Mat::~Mat((Mat *)0x4c7527);
                  local_5f4 = 1.0 / (float)local_a40;
                  auVar1 = vinsertps_avx(ZEXT416((uint)local_5f4),ZEXT416((uint)local_5f4),0x10);
                  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_5f4),0x20);
                  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_5f4),0x30);
                  auVar2 = vinsertps_avx(ZEXT416((uint)local_5f4),ZEXT416((uint)local_5f4),0x10);
                  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_5f4),0x20);
                  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_5f4),0x30);
                  auVar33._16_16_ = auVar1;
                  auVar33._0_16_ = auVar2;
                  local_c0._0_8_ = auVar2._0_8_;
                  uVar5 = local_c0._0_8_;
                  local_c0._8_8_ = auVar2._8_8_;
                  uVar6 = local_c0._8_8_;
                  local_c0._16_8_ = auVar1._0_8_;
                  uVar7 = local_c0._16_8_;
                  local_c0._24_8_ = auVar1._8_8_;
                  uVar8 = local_c0._24_8_;
                  local_d58 = pfVar26;
                  local_c0 = auVar33;
                  local_a0 = local_5f4;
                  local_9c = local_5f4;
                  local_98 = local_5f4;
                  local_94 = local_5f4;
                  local_90 = local_5f4;
                  local_8c = local_5f4;
                  local_88 = local_5f4;
                  local_84 = local_5f4;
                  for (local_dc4 = 0; local_dc4 < local_a3c; local_dc4 = local_dc4 + 1) {
                    for (local_dc8 = 0; local_dc8 < local_a38; local_dc8 = local_dc8 + 1) {
                      pfVar26 = ncnn::Mat::row(&local_d50,
                                               local_dc4 *
                                               *(int *)((long)in_RDI +
                                                       *(long *)(*in_RDI + -0x18) + 0xe0));
                      local_5f8 = 0;
                      local_50 = 0;
                      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
                      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
                      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
                      auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
                      auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
                      auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
                      auVar34._16_16_ = auVar3;
                      auVar34._0_16_ = auVar4;
                      local_80._0_8_ = auVar4._0_8_;
                      local_80._8_8_ = auVar4._8_8_;
                      local_80._16_8_ = auVar3._0_8_;
                      local_80._24_8_ = auVar3._8_8_;
                      local_e00 = local_80._0_8_;
                      uStack_df8 = local_80._8_8_;
                      uStack_df0 = local_80._16_8_;
                      uStack_de8 = local_80._24_8_;
                      local_e04 = 0;
                      while( true ) {
                        uVar12 = uStack_5a8;
                        uVar11 = uStack_5b0;
                        uVar10 = uStack_5b8;
                        uVar9 = local_5c0;
                        uStack_5a8._0_4_ = (float)uStack_de8;
                        uStack_5a8._4_4_ = (float)((ulong)uStack_de8 >> 0x20);
                        uStack_5b0._0_4_ = (float)uStack_df0;
                        uStack_5b0._4_4_ = (float)((ulong)uStack_df0 >> 0x20);
                        local_5c0._0_4_ = (float)local_e00;
                        local_5c0._4_4_ = (float)((ulong)local_e00 >> 0x20);
                        uStack_5b8._0_4_ = (float)uStack_df8;
                        uStack_5b8._4_4_ = (float)((ulong)uStack_df8 >> 0x20);
                        if (local_a40 <= local_e04) break;
                        local_7d8 = pfVar26 + (long)(local_dc8 *
                                                     *(int *)((long)in_RDI +
                                                             *(long *)(*in_RDI + -0x18) + 0xdc) * 8)
                                              + (long)(local_a68[local_e04] << 3);
                        uVar9 = *(undefined8 *)local_7d8;
                        uVar10 = *(undefined8 *)(local_7d8 + 2);
                        uVar11 = *(undefined8 *)(local_7d8 + 4);
                        uVar12 = *(undefined8 *)(local_7d8 + 6);
                        uVar13 = local_e00;
                        uVar14 = uStack_df8;
                        uVar15 = uStack_df0;
                        uVar16 = uStack_de8;
                        local_5e0._0_4_ = (float)uVar9;
                        local_5e0._4_4_ = (float)((ulong)uVar9 >> 0x20);
                        uStack_5d8._0_4_ = (float)uVar10;
                        uStack_5d8._4_4_ = (float)((ulong)uVar10 >> 0x20);
                        uStack_5d0._0_4_ = (float)uVar11;
                        uStack_5d0._4_4_ = (float)((ulong)uVar11 >> 0x20);
                        uStack_5c8._0_4_ = (float)uVar12;
                        uStack_5c8._4_4_ = (float)((ulong)uVar12 >> 0x20);
                        local_e00 = CONCAT44(local_5c0._4_4_ + local_5e0._4_4_,
                                             (float)local_5c0 + (float)local_5e0);
                        uStack_df8 = CONCAT44(uStack_5b8._4_4_ + uStack_5d8._4_4_,
                                              (float)uStack_5b8 + (float)uStack_5d8);
                        uStack_df0 = CONCAT44(uStack_5b0._4_4_ + uStack_5d0._4_4_,
                                              (float)uStack_5b0 + (float)uStack_5d0);
                        uStack_de8 = CONCAT44(uStack_5a8._4_4_ + uStack_5c8._4_4_,
                                              (float)uStack_5a8 + (float)uStack_5c8);
                        local_e04 = local_e04 + 1;
                        local_5e0 = uVar9;
                        uStack_5d8 = uVar10;
                        uStack_5d0 = uVar11;
                        uStack_5c8 = uVar12;
                        local_5c0 = uVar13;
                        uStack_5b8 = uVar14;
                        uStack_5b0 = uVar15;
                        uStack_5a8 = uVar16;
                      }
                      local_500._8_8_ = uStack_df8;
                      local_500._0_8_ = local_e00;
                      local_500._16_8_ = uStack_df0;
                      local_500._24_8_ = uStack_de8;
                      local_520._0_4_ = auVar2._0_4_;
                      local_520._4_4_ = auVar2._4_4_;
                      uStack_518._0_4_ = auVar2._8_4_;
                      uStack_518._4_4_ = auVar2._12_4_;
                      uStack_510._0_4_ = auVar1._0_4_;
                      uStack_510._4_4_ = auVar1._4_4_;
                      uStack_508._0_4_ = auVar1._8_4_;
                      local_720 = CONCAT44(local_5c0._4_4_ * local_520._4_4_,
                                           (float)local_5c0 * (float)local_520);
                      uStack_718 = CONCAT44(uStack_5b8._4_4_ * uStack_518._4_4_,
                                            (float)uStack_5b8 * (float)uStack_518);
                      uStack_710 = CONCAT44(uStack_5b0._4_4_ * uStack_510._4_4_,
                                            (float)uStack_5b0 * (float)uStack_510);
                      uStack_708 = CONCAT44(uStack_5a8._4_4_,(float)uStack_5a8 * (float)uStack_508);
                      local_6e8 = local_d58 + (local_dc8 << 3);
                      *(undefined8 *)local_6e8 = local_720;
                      *(undefined8 *)(local_6e8 + 2) = uStack_718;
                      *(undefined8 *)(local_6e8 + 4) = uStack_710;
                      *(undefined8 *)(local_6e8 + 6) = uStack_708;
                      local_5c0 = uVar9;
                      uStack_5b8 = uVar10;
                      uStack_5b0 = uVar11;
                      uStack_5a8 = uVar12;
                      local_520 = uVar5;
                      uStack_518 = uVar6;
                      uStack_510 = uVar7;
                      uStack_508 = uVar8;
                      local_80 = auVar34;
                      local_4c = local_50;
                      local_48 = local_50;
                      local_44 = local_50;
                      local_40 = local_50;
                      local_3c = local_50;
                      local_38 = local_50;
                      local_34 = local_50;
                    }
                    local_d58 = local_d58 + (local_a38 << 3);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c7a26);
                }
              }
            }
            local_7dc = 0;
            local_a34 = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe838);
          }
        }
        ncnn::Mat::~Mat((Mat *)0x4c7a92);
      }
      else {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                          in_stack_ffffffffffffe844,(size_t)in_stack_ffffffffffffe838,
                          CONCAT13(in_stack_ffffffffffffe837,
                                   CONCAT12(in_stack_ffffffffffffe836,in_stack_ffffffffffffe834)),
                          (Allocator *)CONCAT44(in_stack_ffffffffffffe82c,in_stack_ffffffffffffe828)
                         );
        bVar22 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                  in_stack_ffffffffffffe828));
        if (bVar22) {
          local_7dc = -100;
        }
        else {
          local_81c = local_808 * local_80c;
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
            for (local_820 = 0; local_820 < local_810; local_820 = local_820 + 1) {
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850
                                                ),(int)in_stack_ffffffffffffe84c);
              pauVar25 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_870);
              ncnn::Mat::~Mat((Mat *)0x4c5ede);
              local_8a0 = *pauVar25;
              local_828 = pauVar25;
              for (local_8a4 = 0; local_8a4 < local_81c; local_8a4 = local_8a4 + 1) {
                local_7b0 = local_828;
                local_8e0 = *(undefined8 *)*local_828;
                uStack_8d8 = *(undefined8 *)(*local_828 + 8);
                uStack_8d0 = *(undefined8 *)(*local_828 + 0x10);
                uStack_8c8 = *(undefined8 *)(*local_828 + 0x18);
                local_740 = local_8a0._0_8_;
                uStack_738 = local_8a0._8_8_;
                uStack_730 = local_8a0._16_8_;
                uStack_728 = local_8a0._24_8_;
                local_8a0 = vmaxps_avx(local_8a0,*local_828);
                local_828 = local_828 + 1;
                local_760 = local_8e0;
                uStack_758 = uStack_8d8;
                uStack_750 = uStack_8d0;
                uStack_748 = uStack_8c8;
              }
              local_7a8 = pauVar25;
              local_8e8 = ncnn::Mat::operator_cast_to_float_(local_7f8);
              local_600 = local_8e8 + (local_820 << 3);
              local_620 = local_8a0._0_8_;
              uStack_618 = local_8a0._8_8_;
              uStack_610 = local_8a0._16_8_;
              uStack_608 = local_8a0._24_8_;
              *(undefined8 *)local_600 = local_8a0._0_8_;
              *(undefined8 *)(local_600 + 2) = local_8a0._8_8_;
              *(undefined8 *)(local_600 + 4) = local_8a0._16_8_;
              *(undefined8 *)(local_600 + 6) = local_8a0._24_8_;
            }
          }
          else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
            for (local_8ec = 0; local_8ec < local_810; local_8ec = local_8ec + 1) {
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850
                                                ),(int)in_stack_ffffffffffffe84c);
              pfVar26 = ncnn::Mat::operator_cast_to_float_(&local_940);
              ncnn::Mat::~Mat((Mat *)0x4c60ef);
              local_5e4 = 0;
              local_184 = 0;
              local_188 = 0;
              local_18c = 0;
              local_190 = 0;
              local_194 = 0;
              local_198 = 0;
              local_19c = 0;
              local_1a0 = 0;
              auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
              auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
              auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
              auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
              auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
              auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
              auVar29._16_16_ = auVar1;
              auVar29._0_16_ = auVar2;
              local_1c0._0_8_ = auVar2._0_8_;
              local_1c0._8_8_ = auVar2._8_8_;
              local_1c0._16_8_ = auVar1._0_8_;
              local_1c0._24_8_ = auVar1._8_8_;
              local_960 = local_1c0._0_8_;
              uStack_958 = local_1c0._8_8_;
              uStack_950 = local_1c0._16_8_;
              uStack_948 = local_1c0._24_8_;
              local_964 = 0;
              local_8f8 = pfVar26;
              while( true ) {
                uVar8 = uStack_528;
                uVar7 = uStack_530;
                uVar6 = uStack_538;
                uVar5 = local_540;
                local_540._0_4_ = (float)local_960;
                local_540._4_4_ = (float)((ulong)local_960 >> 0x20);
                uStack_538._0_4_ = (float)uStack_958;
                uStack_538._4_4_ = (float)((ulong)uStack_958 >> 0x20);
                uStack_530._0_4_ = (float)uStack_950;
                uStack_530._4_4_ = (float)((ulong)uStack_950 >> 0x20);
                uStack_528._0_4_ = (float)uStack_948;
                uStack_528._4_4_ = (float)((ulong)uStack_948 >> 0x20);
                if (local_81c <= local_964) break;
                local_7b8 = local_8f8;
                local_9a0 = *(undefined8 *)local_8f8;
                uStack_998 = *(undefined8 *)(local_8f8 + 2);
                uStack_990 = *(undefined8 *)(local_8f8 + 4);
                uStack_988 = *(undefined8 *)(local_8f8 + 6);
                uVar5 = local_960;
                uVar6 = uStack_958;
                uVar7 = uStack_950;
                uVar8 = uStack_948;
                local_560._0_4_ = (float)local_9a0;
                local_560._4_4_ = (float)((ulong)local_9a0 >> 0x20);
                uStack_558._0_4_ = (float)uStack_998;
                uStack_558._4_4_ = (float)((ulong)uStack_998 >> 0x20);
                uStack_550._0_4_ = (float)uStack_990;
                uStack_550._4_4_ = (float)((ulong)uStack_990 >> 0x20);
                uStack_548._0_4_ = (float)uStack_988;
                uStack_548._4_4_ = (float)((ulong)uStack_988 >> 0x20);
                local_960 = CONCAT44(local_540._4_4_ + local_560._4_4_,
                                     (float)local_540 + (float)local_560);
                uStack_958 = CONCAT44(uStack_538._4_4_ + uStack_558._4_4_,
                                      (float)uStack_538 + (float)uStack_558);
                uStack_950 = CONCAT44(uStack_530._4_4_ + uStack_550._4_4_,
                                      (float)uStack_530 + (float)uStack_550);
                uStack_948 = CONCAT44(uStack_528._4_4_ + uStack_548._4_4_,
                                      (float)uStack_528 + (float)uStack_548);
                local_8f8 = local_8f8 + 8;
                local_964 = local_964 + 1;
                local_560 = local_9a0;
                uStack_558 = uStack_998;
                uStack_550 = uStack_990;
                uStack_548 = uStack_988;
                local_540 = uVar5;
                uStack_538 = uVar6;
                uStack_530 = uVar7;
                uStack_528 = uVar8;
              }
              local_5e8 = 1.0 / (float)local_81c;
              auVar1 = vinsertps_avx(ZEXT416((uint)local_5e8),ZEXT416((uint)local_5e8),0x10);
              auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_5e8),0x20);
              auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_5e8),0x30);
              auVar2 = vinsertps_avx(ZEXT416((uint)local_5e8),ZEXT416((uint)local_5e8),0x10);
              auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_5e8),0x20);
              auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_5e8),0x30);
              auVar30._16_16_ = auVar1;
              auVar30._0_16_ = auVar2;
              local_180._0_8_ = auVar2._0_8_;
              local_180._8_8_ = auVar2._8_8_;
              local_180._16_8_ = auVar1._0_8_;
              local_180._24_8_ = auVar1._8_8_;
              local_9c0 = local_180._0_8_;
              uStack_9b8 = local_180._8_8_;
              uStack_9b0 = local_180._16_8_;
              uStack_9a8 = local_180._24_8_;
              local_480 = local_960;
              uStack_478 = uStack_958;
              uStack_470 = uStack_950;
              uStack_468 = uStack_948;
              local_4a0 = local_180._0_8_;
              uVar9 = local_4a0;
              uStack_498 = local_180._8_8_;
              uVar10 = uStack_498;
              uStack_490 = local_180._16_8_;
              uVar11 = uStack_490;
              uStack_488 = local_180._24_8_;
              uVar12 = uStack_488;
              local_4a0._0_4_ = auVar2._0_4_;
              local_4a0._4_4_ = auVar2._4_4_;
              uStack_498._0_4_ = auVar2._8_4_;
              uStack_498._4_4_ = auVar2._12_4_;
              uStack_490._0_4_ = auVar1._0_4_;
              uStack_490._4_4_ = auVar1._4_4_;
              uStack_488._0_4_ = auVar1._8_4_;
              local_9e0 = (float)local_540 * (float)local_4a0;
              fStack_9dc = local_540._4_4_ * local_4a0._4_4_;
              fStack_9d8 = (float)uStack_538 * (float)uStack_498;
              fStack_9d4 = uStack_538._4_4_ * uStack_498._4_4_;
              fStack_9d0 = (float)uStack_530 * (float)uStack_490;
              fStack_9cc = uStack_530._4_4_ * uStack_490._4_4_;
              fStack_9c8 = (float)uStack_528 * (float)uStack_488;
              fStack_9c4 = uStack_528._4_4_;
              local_540 = uVar5;
              uStack_538 = uVar6;
              uStack_530 = uVar7;
              uStack_528 = uVar8;
              local_4a0 = uVar9;
              uStack_498 = uVar10;
              uStack_490 = uVar11;
              uStack_488 = uVar12;
              local_1c0 = auVar29;
              local_180 = auVar30;
              local_160 = local_5e8;
              local_15c = local_5e8;
              local_158 = local_5e8;
              local_154 = local_5e8;
              local_150 = local_5e8;
              local_14c = local_5e8;
              local_148 = local_5e8;
              local_144 = local_5e8;
              local_9e8 = ncnn::Mat::operator_cast_to_float_(local_7f8);
              local_628 = local_9e8 + (local_8ec << 3);
              local_660 = CONCAT44(fStack_9dc,local_9e0);
              uStack_658 = CONCAT44(fStack_9d4,fStack_9d8);
              uStack_650 = CONCAT44(fStack_9cc,fStack_9d0);
              uStack_648 = CONCAT44(fStack_9c4,fStack_9c8);
              *(undefined8 *)local_628 = local_660;
              *(undefined8 *)(local_628 + 2) = uStack_658;
              *(undefined8 *)(local_628 + 4) = uStack_650;
              *(undefined8 *)(local_628 + 6) = uStack_648;
            }
          }
          local_7dc = 0;
        }
      }
    }
    else if (local_804 == 4) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) == 0) {
        pMVar35 = &local_ff0;
        ncnn::Mat::Mat(pMVar35);
        Pooling::make_padding
                  ((Pooling *)CONCAT44(in_stack_ffffffffffffe9ac,in_stack_ffffffffffffe9a8),
                   (Mat *)CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                   in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
        uVar23 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                  in_stack_ffffffffffffe828));
        if ((bool)uVar23) {
          local_7dc = -100;
          local_a34 = 1;
        }
        else {
          local_808 = local_ff0.w;
          local_80c = local_ff0.h;
          local_ff4 = (local_ff0.w - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)) /
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + 1;
          local_ff8 = (local_ff0.h - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)) /
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) + 1;
          ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                            in_stack_ffffffffffffe844,in_stack_ffffffffffffe840,
                            (int)((ulong)in_stack_ffffffffffffe838 >> 0x20),
                            CONCAT17(in_stack_ffffffffffffe837,
                                     CONCAT16(in_stack_ffffffffffffe836,
                                              CONCAT24(in_stack_ffffffffffffe834,
                                                       in_stack_ffffffffffffe830))),
                            in_stack_ffffffffffffe82c,
                            (Allocator *)
                            CONCAT44(in_stack_ffffffffffffe85c,in_stack_ffffffffffffe858));
          uVar24 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                    in_stack_ffffffffffffe828));
          if ((bool)uVar24) {
            local_7dc = -100;
            local_a34 = 1;
          }
          else {
            local_ffc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            std::allocator<int>::allocator((allocator<int> *)0x4c81cf);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                       CONCAT44(in_stack_ffffffffffffe844,in_stack_ffffffffffffe840),
                       in_stack_ffffffffffffe838);
            std::allocator<int>::~allocator((allocator<int> *)0x4c81fb);
            local_1028 = std::vector<int,_std::allocator<int>_>::operator[](&local_1018,0);
            local_102c = 0;
            local_1030 = 0;
            local_1034 = local_808 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            for (local_1038 = 0;
                local_1038 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                local_1038 = local_1038 + 1) {
              for (local_103c = 0;
                  local_103c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_103c = local_103c + 1) {
                local_1028[local_102c] = local_1030;
                local_102c = local_102c + 1;
                local_1030 = local_1030 + 1;
              }
              local_1030 = local_1034 + local_1030;
            }
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
              if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 2) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 2)) &&
                 ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 2 &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2)))) {
                pooling2x2s2_max_pack4_sse
                          (in_stack_ffffffffffffe980,pMVar35,
                           (Option *)CONCAT17(uVar23,CONCAT16(uVar24,in_stack_ffffffffffffe970)));
              }
              else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 2 &&
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2)))) {
                pooling3x3s2_max_pack4_sse
                          ((Mat *)CONCAT44(in_stack_ffffffffffffeb04,in_stack_ffffffffffffeb00),
                           in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
              }
              else {
                for (local_1040 = 0; local_1040 < local_810; local_1040 = local_1040 + 1) {
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  pfVar26 = ncnn::Mat::operator_cast_to_float_(&local_10d8);
                  ncnn::Mat::~Mat((Mat *)0x4c8543);
                  local_1090 = pfVar26;
                  for (local_10dc = 0; local_10dc < local_ff8; local_10dc = local_10dc + 1) {
                    for (local_10e0 = 0; local_10e0 < local_ff4; local_10e0 = local_10e0 + 1) {
                      local_10e8 = ncnn::Mat::row(&local_1088,
                                                  local_10dc *
                                                  *(int *)((long)in_RDI +
                                                          *(long *)(*in_RDI + -0x18) + 0xe0));
                      local_10e8 = local_10e8 +
                                   local_10e0 *
                                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 4;
                      local_1100 = *(undefined8 *)local_10e8;
                      uStack_10f8 = *(undefined8 *)(local_10e8 + 2);
                      for (local_1104 = 0; local_1104 < local_ffc; local_1104 = local_1104 + 1) {
                        local_448 = (undefined1 (*) [16])
                                    (local_10e8 + (local_1028[local_1104] << 2));
                        local_1120 = *(undefined8 *)*local_448;
                        uStack_1118 = *(undefined8 *)(*local_448 + 8);
                        local_410 = local_1100;
                        uStack_408 = uStack_10f8;
                        auVar20._8_8_ = uStack_10f8;
                        auVar20._0_8_ = local_1100;
                        auVar1 = vmaxps_avx(auVar20,*local_448);
                        local_16e0 = auVar1._0_8_;
                        uStack_10f8 = auVar1._8_8_;
                        local_1100 = local_16e0;
                        local_420 = local_1120;
                        uStack_418 = uStack_1118;
                      }
                      local_388 = (undefined1 (*) [16])(local_1090 + (local_10e0 << 2));
                      local_3a0 = local_1100;
                      uStack_398 = uStack_10f8;
                      auVar21._8_8_ = uStack_10f8;
                      auVar21._0_8_ = local_1100;
                      *local_388 = auVar21;
                      local_440 = local_10e8;
                    }
                    local_1090 = local_1090 + (local_ff4 << 2);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c8804);
                }
              }
            }
            else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) {
                local_1124 = 0;
                local_1128 = 0;
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 0) {
                  local_1124 = ((local_ff0.w - *(int *)(local_7f0 + 0x2c)) -
                               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4)) -
                               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8);
                  local_1128 = ((local_ff0.h - *(int *)(local_7f0 + 0x30)) -
                               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec)) -
                               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
                }
                for (local_112c = 0; local_112c < local_810; local_112c = local_112c + 1) {
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  local_1180 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffee38);
                  ncnn::Mat::~Mat((Mat *)0x4c898b);
                  for (local_11cc = 0; local_11cc < local_ff8; local_11cc = local_11cc + 1) {
                    local_11d0 = local_11cc *
                                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
                    for (local_11d4 = 0; local_11d4 < local_ff4; local_11d4 = local_11d4 + 1) {
                      local_11d8 = local_11d4 *
                                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
                      local_2c4 = 0;
                      local_2e0 = 0;
                      uStack_2dc = 0;
                      uStack_2d8 = 0;
                      uStack_2d4 = 0;
                      local_11f0 = 0;
                      uStack_11e8 = 0;
                      local_11f4 = 0;
                      for (local_11f8 = 0;
                          local_11f8 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                          local_11f8 = local_11f8 + 1) {
                        local_11fc = local_11d0 + local_11f8;
                        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) <= local_11fc
                           ) {
                          if ((local_80c -
                              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0)) -
                              local_1128 <= local_11fc) break;
                          for (local_1200 = 0;
                              local_1200 <
                              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                              local_1200 = local_1200 + 1) {
                            local_1204 = local_11d8 + local_1200;
                            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) <=
                                local_1204) {
                              if ((local_808 -
                                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) -
                                  local_1124 <= local_1204) break;
                              local_450 = ncnn::Mat::row(&local_1178,local_11fc);
                              local_450 = local_450 + (local_1204 << 2);
                              local_1220 = *(undefined8 *)local_450;
                              uStack_1218 = *(undefined8 *)(local_450 + 2);
                              auVar2._8_8_ = uStack_11e8;
                              auVar2._0_8_ = local_11f0;
                              local_250._0_4_ = (undefined4)local_11f0;
                              local_250._4_4_ = (undefined4)((ulong)local_11f0 >> 0x20);
                              fStack_248 = (float)uStack_11e8;
                              fStack_244 = (float)((ulong)uStack_11e8 >> 0x20);
                              local_260._0_4_ = (float)local_1220;
                              local_260._4_4_ = (float)((ulong)local_1220 >> 0x20);
                              uStack_258._0_4_ = (float)uStack_1218;
                              uStack_258._4_4_ = (float)((ulong)uStack_1218 >> 0x20);
                              local_11f0 = CONCAT44((float)local_250._4_4_ + local_260._4_4_,
                                                    (float)local_250._0_4_ + (float)local_260);
                              uStack_11e8 = CONCAT44(fStack_244 + uStack_258._4_4_,
                                                     fStack_248 + (float)uStack_258);
                              local_11f4 = local_11f4 + 1;
                              local_260 = local_1220;
                              uStack_258 = uStack_1218;
                              _local_250 = auVar2;
                            }
                          }
                        }
                      }
                      local_300 = 1.0 / (float)local_11f4;
                      local_1230 = CONCAT44(local_300,local_300);
                      uStack_1228 = CONCAT44(local_300,local_300);
                      auVar3._8_8_ = uStack_11e8;
                      auVar3._0_8_ = local_11f0;
                      local_1f0._0_4_ = (undefined4)local_11f0;
                      local_1f0._4_4_ = (undefined4)((ulong)local_11f0 >> 0x20);
                      fStack_1e8 = (float)uStack_11e8;
                      fStack_1e4 = (float)((ulong)uStack_11e8 >> 0x20);
                      local_1240 = CONCAT44((float)local_1f0._4_4_ * local_300,
                                            (float)local_1f0._0_4_ * local_300);
                      uStack_1238 = CONCAT44(fStack_1e4 * local_300,fStack_1e8 * local_300);
                      local_3a8 = (undefined1 (*) [16])(local_1180 + (local_11d4 << 2));
                      auVar4._8_8_ = uStack_1238;
                      auVar4._0_8_ = local_1240;
                      *local_3a8 = auVar4;
                      local_3c0 = local_1240;
                      uStack_3b8 = uStack_1238;
                      fStack_2fc = local_300;
                      fStack_2f8 = local_300;
                      fStack_2f4 = local_300;
                      local_2e4 = local_300;
                      local_200 = local_1230;
                      uStack_1f8 = uStack_1228;
                      _local_1f0 = auVar3;
                    }
                    local_1180 = local_1180 + (local_ff4 << 2);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c8e30);
                }
              }
              else {
                for (local_1244 = 0; local_1244 < local_810; local_1244 = local_1244 + 1) {
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,
                                                     in_stack_ffffffffffffe850),
                                     (int)in_stack_ffffffffffffe84c);
                  pfVar26 = ncnn::Mat::operator_cast_to_float_(&local_12e0);
                  ncnn::Mat::~Mat((Mat *)0x4c8edc);
                  local_320 = 1.0 / (float)local_ffc;
                  local_12f0._4_4_ = local_320;
                  local_12f0._0_4_ = local_320;
                  local_12f0._12_4_ = local_320;
                  local_12f0._8_4_ = local_320;
                  local_1298 = pfVar26;
                  fStack_31c = local_320;
                  fStack_318 = local_320;
                  fStack_314 = local_320;
                  local_304 = local_320;
                  for (local_12f4 = 0; local_12f4 < local_ff8; local_12f4 = local_12f4 + 1) {
                    for (local_12f8 = 0; local_12f8 < local_ff4; local_12f8 = local_12f8 + 1) {
                      local_1300 = ncnn::Mat::row(&local_1290,
                                                  local_12f4 *
                                                  *(int *)((long)in_RDI +
                                                          *(long *)(*in_RDI + -0x18) + 0xe0));
                      local_1300 = local_1300 +
                                   local_12f8 *
                                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 4;
                      local_324 = 0;
                      local_340 = 0;
                      local_1310 = 0;
                      uStack_1308 = 0;
                      local_1314 = 0;
                      while( true ) {
                        uVar6 = uStack_268;
                        uVar5 = local_270;
                        local_270._0_4_ = (float)local_1310;
                        local_270._4_4_ = (float)((ulong)local_1310 >> 0x20);
                        uStack_268._0_4_ = (float)uStack_1308;
                        uStack_268._4_4_ = (float)((ulong)uStack_1308 >> 0x20);
                        if (local_ffc <= local_1314) break;
                        local_458 = local_1300 + (local_1028[local_1314] << 2);
                        local_1330 = *(undefined8 *)local_458;
                        uStack_1328 = *(undefined8 *)(local_458 + 2);
                        uVar5 = local_1310;
                        uVar6 = uStack_1308;
                        local_280._0_4_ = (float)local_1330;
                        local_280._4_4_ = (float)((ulong)local_1330 >> 0x20);
                        uStack_278._0_4_ = (float)uStack_1328;
                        uStack_278._4_4_ = (float)((ulong)uStack_1328 >> 0x20);
                        in_stack_ffffffffffffe850 = (float)local_270 + (float)local_280;
                        in_stack_ffffffffffffe854 = local_270._4_4_ + local_280._4_4_;
                        local_1310 = CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850);
                        uStack_1308 = CONCAT44(uStack_268._4_4_ + uStack_278._4_4_,
                                               (float)uStack_268 + (float)uStack_278);
                        local_1314 = local_1314 + 1;
                        local_280 = local_1330;
                        uStack_278 = uStack_1328;
                        local_270 = uVar5;
                        uStack_268 = uVar6;
                      }
                      local_210._8_8_ = uStack_1308;
                      local_210._0_8_ = local_1310;
                      local_220._0_4_ = local_12f0._0_4_;
                      local_220._4_4_ = local_12f0._4_4_;
                      uStack_218._0_4_ = local_12f0._8_4_;
                      uStack_218._4_4_ = local_12f0._12_4_;
                      in_stack_ffffffffffffe84c = uStack_268._4_4_ * uStack_218._4_4_;
                      local_1340 = CONCAT44(local_270._4_4_ * local_220._4_4_,
                                            (float)local_270 * (float)local_220);
                      uStack_1338 = CONCAT44(in_stack_ffffffffffffe84c,
                                             (float)uStack_268 * (float)uStack_218);
                      local_3c8 = (undefined1 (*) [16])(local_1298 + (local_12f8 << 2));
                      auVar1._8_8_ = uStack_1338;
                      auVar1._0_8_ = local_1340;
                      *local_3c8 = auVar1;
                      local_3e0 = local_1340;
                      uStack_3d8 = uStack_1338;
                      uStack_33c = local_340;
                      uStack_338 = local_340;
                      uStack_334 = local_340;
                      local_270 = uVar5;
                      uStack_268 = uVar6;
                      local_220 = local_12f0._0_8_;
                      uStack_218 = local_12f0._8_8_;
                    }
                    local_1298 = local_1298 + (local_ff4 << 2);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c9225);
                }
              }
            }
            local_7dc = 0;
            local_a34 = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe838);
          }
        }
        ncnn::Mat::~Mat((Mat *)0x4c9291);
      }
      else {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                          in_stack_ffffffffffffe844,(size_t)in_stack_ffffffffffffe838,
                          CONCAT13(in_stack_ffffffffffffe837,
                                   CONCAT12(in_stack_ffffffffffffe836,in_stack_ffffffffffffe834)),
                          (Allocator *)CONCAT44(in_stack_ffffffffffffe82c,in_stack_ffffffffffffe828)
                         );
        bVar22 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                  in_stack_ffffffffffffe828));
        if (bVar22) {
          local_7dc = -100;
        }
        else {
          iVar28 = local_808 * local_80c;
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
            for (local_e68 = 0; local_e68 < local_810; local_e68 = local_e68 + 1) {
              pMVar35 = (Mat *)&stack0xfffffffffffff148;
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850
                                                ),(int)in_stack_ffffffffffffe84c);
              pauVar27 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(pMVar35);
              ncnn::Mat::~Mat((Mat *)0x4c7bc0);
              local_ed0 = *pauVar27;
              local_e70 = pauVar27;
              for (local_ed4 = 0; local_ed4 < iVar28; local_ed4 = local_ed4 + 1) {
                local_430 = local_e70;
                local_ef0 = *(undefined8 *)*local_e70;
                uStack_ee8 = *(undefined8 *)(*local_e70 + 8);
                local_3f0 = local_ed0._0_8_;
                uStack_3e8 = local_ed0._8_8_;
                local_ed0 = vmaxps_avx(local_ed0,*local_e70);
                local_e70 = local_e70 + 1;
                local_400 = local_ef0;
                uStack_3f8 = uStack_ee8;
              }
              local_428 = pauVar27;
              local_ef8 = ncnn::Mat::operator_cast_to_float_(local_7f8);
              local_348 = local_ef8 + (local_e68 << 2);
              local_360 = local_ed0._0_8_;
              uStack_358 = local_ed0._8_8_;
              *(undefined8 *)local_348 = local_ed0._0_8_;
              *(undefined8 *)(local_348 + 2) = local_ed0._8_8_;
            }
          }
          else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
            for (local_efc = 0; local_efc < local_810; local_efc = local_efc + 1) {
              pMVar35 = &local_f50;
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850
                                                ),(int)in_stack_ffffffffffffe84c);
              pfVar26 = ncnn::Mat::operator_cast_to_float_(pMVar35);
              ncnn::Mat::~Mat((Mat *)0x4c7dcb);
              local_284 = 0;
              local_2a0 = 0;
              uStack_29c = 0;
              uStack_298 = 0;
              uStack_294 = 0;
              local_f60 = 0;
              uStack_f58 = 0;
              local_f64 = 0;
              local_f08 = pfVar26;
              while( true ) {
                uVar6 = uStack_228;
                uVar5 = local_230;
                local_230._0_4_ = (float)local_f60;
                local_230._4_4_ = (float)((ulong)local_f60 >> 0x20);
                uStack_228._0_4_ = (float)uStack_f58;
                uStack_228._4_4_ = (float)((ulong)uStack_f58 >> 0x20);
                if (iVar28 <= local_f64) break;
                local_438 = local_f08;
                local_f80 = *(undefined8 *)local_f08;
                uStack_f78 = *(undefined8 *)(local_f08 + 2);
                uVar5 = local_f60;
                uVar6 = uStack_f58;
                local_240._0_4_ = (float)local_f80;
                local_240._4_4_ = (float)((ulong)local_f80 >> 0x20);
                uStack_238._0_4_ = (float)uStack_f78;
                uStack_238._4_4_ = (float)((ulong)uStack_f78 >> 0x20);
                local_f60 = CONCAT44(local_230._4_4_ + local_240._4_4_,
                                     (float)local_230 + (float)local_240);
                uStack_f58 = CONCAT44(uStack_228._4_4_ + uStack_238._4_4_,
                                      (float)uStack_228 + (float)uStack_238);
                local_f08 = local_f08 + 4;
                local_f64 = local_f64 + 1;
                local_240 = local_f80;
                uStack_238 = uStack_f78;
                local_230 = uVar5;
                uStack_228 = uVar6;
              }
              local_2c0 = 1.0 / (float)iVar28;
              local_f90 = CONCAT44(local_2c0,local_2c0);
              uStack_f88 = CONCAT44(local_2c0,local_2c0);
              local_1d0 = local_f60;
              uStack_1c8 = uStack_f58;
              local_fa0 = (float)local_230 * local_2c0;
              fStack_f9c = local_230._4_4_ * local_2c0;
              fStack_f98 = (float)uStack_228 * local_2c0;
              fStack_f94 = uStack_228._4_4_ * local_2c0;
              fStack_2bc = local_2c0;
              fStack_2b8 = local_2c0;
              fStack_2b4 = local_2c0;
              local_2a4 = local_2c0;
              local_230 = uVar5;
              uStack_228 = uVar6;
              local_1e0 = local_f90;
              uStack_1d8 = uStack_f88;
              local_fa8 = ncnn::Mat::operator_cast_to_float_(local_7f8);
              local_368 = local_fa8 + (local_efc << 2);
              local_380 = CONCAT44(fStack_f9c,local_fa0);
              uStack_378 = CONCAT44(fStack_f94,fStack_f98);
              *(undefined8 *)local_368 = local_380;
              *(undefined8 *)(local_368 + 2) = uStack_378;
            }
          }
          local_7dc = 0;
        }
      }
    }
    else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) ==
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)) &&
            (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) ==
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0))) {
      local_1344 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
      if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) && (local_1344 == 2))
         && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) != 1)) {
        local_1348 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        if (local_1348 == 2) {
          pMVar35 = &local_1390;
          ncnn::Mat::Mat(pMVar35);
          iVar28 = (int)((ulong)pMVar35 >> 0x20);
          Pooling::make_padding
                    ((Pooling *)CONCAT44(in_stack_ffffffffffffe9ac,in_stack_ffffffffffffe9a8),
                     (Mat *)CONCAT44(in_stack_ffffffffffffe9a4,in_stack_ffffffffffffe9a0),
                     in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
          bVar22 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                    in_stack_ffffffffffffe828));
          if (bVar22) {
            local_7dc = -100;
          }
          else {
            local_808 = local_1390.w;
            local_80c = local_1390.h;
            ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                              in_stack_ffffffffffffe844,in_stack_ffffffffffffe840,iVar28,
                              CONCAT17(bVar22,CONCAT16(in_stack_ffffffffffffe836,
                                                       CONCAT24(in_stack_ffffffffffffe834,
                                                                in_stack_ffffffffffffe830))),
                              (Allocator *)
                              CONCAT44(in_stack_ffffffffffffe82c,in_stack_ffffffffffffe828));
            bVar22 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe82c,
                                                      in_stack_ffffffffffffe828));
            if (bVar22) {
              local_7dc = -100;
            }
            else {
              if (local_1348 == 2) {
                pooling2x2s2_max_avx(in_stack_ffffffffffffe938,in_stack_ffffffffffffe930,local_16e0)
                ;
              }
              local_7dc = 0;
            }
          }
          local_a34 = 1;
          ncnn::Mat::~Mat((Mat *)0x4c95e5);
        }
        else {
          local_7dc = Pooling::forward(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                                       in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
        }
      }
      else {
        local_7dc = Pooling::forward(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                                     in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
      }
    }
    else {
      local_7dc = Pooling::forward(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                                   in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    }
  }
  else {
    local_7dc = Pooling::forward(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                                 in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  }
  return local_7dc;
}

Assistant:

int Pooling_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}